

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
kj::Maybe<kj::Exception>::Maybe(Maybe<kj::Exception> *this,Maybe<kj::Exception> *other)

{
  bool bVar1;
  
  bVar1 = (other->ptr).isSet;
  (this->ptr).isSet = bVar1;
  if (bVar1 == true) {
    Exception::Exception(&(this->ptr).field_1.value,&(other->ptr).field_1.value);
  }
  if ((other->ptr).isSet == true) {
    (other->ptr).isSet = false;
    Exception::~Exception(&(other->ptr).field_1.value);
    return;
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }